

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

void __thiscall duckdb::VersionDeleteState::Flush(VersionDeleteState *this)

{
  idx_t vector_idx;
  transaction_t transaction_id;
  DuckTransaction *this_00;
  DataTable *table;
  RowVersionManager *pRVar1;
  idx_t iVar2;
  
  iVar2 = this->count;
  if (iVar2 != 0) {
    vector_idx = this->current_chunk;
    transaction_id = (this->transaction).transaction_id;
    pRVar1 = RowGroup::GetOrCreateVersionInfo(this->info);
    iVar2 = RowVersionManager::DeleteRows(pRVar1,vector_idx,transaction_id,this->rows,iVar2);
    this->delete_count = this->delete_count + iVar2;
    if ((iVar2 != 0) && ((this->transaction).transaction.ptr != (DuckTransaction *)0x0)) {
      optional_ptr<duckdb::DuckTransaction,_true>::CheckValid(&(this->transaction).transaction);
      this_00 = (this->transaction).transaction.ptr;
      table = this->table;
      pRVar1 = RowGroup::GetOrCreateVersionInfo(this->info);
      DuckTransaction::PushDelete
                (this_00,table,pRVar1,this->current_chunk,this->rows,iVar2,
                 this->chunk_row + this->base_row);
    }
    this->count = 0;
  }
  return;
}

Assistant:

void VersionDeleteState::Flush() {
	if (count == 0) {
		return;
	}
	// it is possible for delete statements to delete the same tuple multiple times when combined with a USING clause
	// in the current_info->Delete, we check which tuples are actually deleted (excluding duplicate deletions)
	// this is returned in the actual_delete_count
	auto actual_delete_count = info.DeleteRows(current_chunk, transaction.transaction_id, rows, count);
	delete_count += actual_delete_count;
	if (transaction.transaction && actual_delete_count > 0) {
		// now push the delete into the undo buffer, but only if any deletes were actually performed
		transaction.transaction->PushDelete(table, info.GetOrCreateVersionInfo(), current_chunk, rows,
		                                    actual_delete_count, base_row + chunk_row);
	}
	count = 0;
}